

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformations_t *
opengv::absolute_pose::upnp(AbsoluteAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices)

{
  Indices *in_RDI;
  Indices idx;
  Indices *in_stack_000024c8;
  AbsoluteAdapterBase *in_stack_000024d0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  
  Indices::Indices(in_RDI,in_stack_ffffffffffffffb8);
  upnp(in_stack_000024d0,in_stack_000024c8);
  return (transformations_t *)in_RDI;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::upnp(
    const AbsoluteAdapterBase & adapter,
    const std::vector<int> & indices )
{
  Indices idx(indices);
  return upnp(adapter,idx);
}